

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void binary_example(void)

{
  format_string<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char>_>_>_>
  fmt;
  format_string<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char>_>_>_>
  fmt_00;
  iterator __n;
  iterator this;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> range_end;
  int i;
  vector<char,_std::allocator<char>_> buf;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  basic_format_string<char,_spdlog::details::dump_info<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  *this_00;
  executor *in_stack_fffffffffffffc00;
  dump_info<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc08;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  iterator range_begin;
  size_t in_stack_fffffffffffffc18;
  int local_30;
  basic_format_string<char,_spdlog::details::dump_info<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_19;
  
  this_00 = &local_19;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffc10,(size_type)in_stack_fffffffffffffc08,
             (allocator_type *)in_stack_fffffffffffffc00);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  for (local_30 = 0; local_30 < 0x50; local_30 = local_30 + 1) {
    std::vector<char,_std::allocator<char>_>::push_back
              (in_stack_fffffffffffffbf0,(value_type_conflict1 *)in_stack_fffffffffffffbe8);
  }
  ::fmt::v8::
  basic_format_string<char,_spdlog::details::dump_info<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::basic_format_string<char[19],_0>(this_00,(char (*) [19])in_stack_fffffffffffffbf0);
  spdlog::to_hex<std::vector<char,std::allocator<char>>>
            (in_stack_fffffffffffffc10,(size_t)in_stack_fffffffffffffc08);
  fmt.str_.size_ = in_stack_fffffffffffffc18;
  fmt.str_.data_ = (char *)in_stack_fffffffffffffc10;
  spdlog::
  info<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>>
            (fmt,in_stack_fffffffffffffc08);
  spdlog::details::executor::~executor(in_stack_fffffffffffffc00);
  ::fmt::v8::
  basic_format_string<char,_spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::basic_format_string<char[28],_0>
            ((basic_format_string<char,_spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
              *)this_00,(char (*) [28])in_stack_fffffffffffffbf0);
  __n = std::begin<std::vector<char,std::allocator<char>>>(in_stack_fffffffffffffbe8);
  range_begin = __n;
  this = std::begin<std::vector<char,std::allocator<char>>>(in_stack_fffffffffffffbe8);
  range_end = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
              operator+((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                        this_00,__n._M_current);
  spdlog::to_hex<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             range_begin._M_current,range_end,(size_t)this._M_current);
  fmt_00.str_.size_ = in_stack_fffffffffffffc18;
  fmt_00.str_.data_ = range_begin._M_current;
  spdlog::
  info<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>>
            (fmt_00,(dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                     *)range_end._M_current);
  spdlog::details::executor::~executor((executor *)this._M_current);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)this._M_current);
  return;
}

Assistant:

void binary_example()
{
    std::vector<char> buf(80);
    for (int i = 0; i < 80; i++)
    {
        buf.push_back(static_cast<char>(i & 0xff));
    }
    spdlog::info("Binary example: {}", spdlog::to_hex(buf));
    spdlog::info("Another binary example:{:n}", spdlog::to_hex(std::begin(buf), std::begin(buf) + 10));
    // more examples:
    // logger->info("uppercase: {:X}", spdlog::to_hex(buf));
    // logger->info("uppercase, no delimiters: {:Xs}", spdlog::to_hex(buf));
    // logger->info("uppercase, no delimiters, no position info: {:Xsp}", spdlog::to_hex(buf));
    // logger->info("hexdump style: {:a}", spdlog::to_hex(buf));
    // logger->info("hexdump style, 20 chars per line {:a}", spdlog::to_hex(buf, 20));
}